

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseFilters::TestCaseFilters(TestCaseFilters *this,string *name)

{
  string *name_local;
  TestCaseFilters *this_local;
  
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::vector
            (&this->m_tagExpressions);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            (&this->m_inclusionFilters);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::vector
            (&this->m_exclusionFilters);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}